

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::UncommittedRegionsAccessTestCase::cleanupDepthStencilFramebuffer
          (UncommittedRegionsAccessTestCase *this,Functions *gl)

{
  GLenum GVar1;
  
  (*gl->deleteFramebuffers)
            (1,(GLuint *)
               &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .field_0x25c);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glDeleteFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x65d);
  (*gl->deleteRenderbuffers)(1,&this->mRenderbuffer);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glDeleteRenderbuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x65f);
  (*gl->bindFramebuffer)(0x8d40,0);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glBindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x662);
  return;
}

Assistant:

void UncommittedRegionsAccessTestCase::cleanupDepthStencilFramebuffer(const Functions& gl)
{
	gl.deleteFramebuffers(1, &mFramebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteFramebuffers");
	gl.deleteRenderbuffers(1, &mRenderbuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteRenderbuffers");

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
}